

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_mirjit.c
# Opt level: O0

void raviV_close(lua_State *L)

{
  global_State *pgVar1;
  global_State *G;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  if (pgVar1->ravi_state != (ravi_State *)0x0) {
    if (pgVar1->ravi_state->jit != (MIR_context_t)0x0) {
      MIR_finish(pgVar1->ravi_state->jit);
    }
    free(pgVar1->ravi_state);
  }
  return;
}

Assistant:

void raviV_close(struct lua_State *L) {
  global_State *G = G(L);
  if (G->ravi_state == NULL)
    return;
  // All compiled functions will be deleted at this stage
  if (G->ravi_state->jit) {
    MIR_finish(G->ravi_state->jit);
  }
  free(G->ravi_state);
}